

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Periodic_acc(int g_a,int *lo,int *hi,void *buf,int *ld,void *alpha)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  void *in_stack_00000258;
  Integer *in_stack_00000260;
  void *in_stack_00000268;
  Integer *in_stack_00000270;
  Integer *in_stack_00000278;
  Integer in_stack_00000280;
  Integer in_stack_00000290;
  int local_104;
  int local_100;
  int local_fc;
  long local_f8 [8];
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_28;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = pnga_ndim(a);
  for (local_fc = 0; local_fc < local_40; local_fc = local_fc + 1) {
    local_78[(local_40 - local_fc) + -1] = (long)*(int *)(local_10 + (long)local_fc * 4) + 1;
  }
  for (local_100 = 0; local_100 < local_40; local_100 = local_100 + 1) {
    local_b8[(local_40 - local_100) + -1] = (long)*(int *)(local_18 + (long)local_100 * 4) + 1;
  }
  for (local_104 = 0; (long)local_104 < local_40 + -1; local_104 = local_104 + 1) {
    local_f8[(local_40 - local_104) + -2] = (long)*(int *)(local_28 + (long)local_104 * 4);
  }
  pnga_periodic(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                in_stack_00000260,in_stack_00000258,in_stack_00000290);
  return;
}

Assistant:

void NGA_Periodic_acc(int g_a, int lo[], int hi[], void* buf,int ld[], void* alpha)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_periodic(a, _ga_lo, _ga_hi, buf, _ga_work, alpha, PERIODIC_ACC);
}